

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

CURLproxycode
Curl_SOCKS4(char *proxy_user,char *hostname,int remote_port,int sockindex,Curl_easy *data,
           _Bool *done)

{
  uchar **ppuVar1;
  undefined1 *puVar2;
  curl_proxytype cVar3;
  curl_socket_t sockfd;
  connectdata *pcVar4;
  uchar *puVar5;
  sockaddr *psVar6;
  uint uVar7;
  resolve_t rVar8;
  CURLcode CVar9;
  connectdata *conn_1;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  uchar *puVar13;
  Curl_addrinfo *ai;
  size_t sVar14;
  connectdata *conn;
  Curl_dns_entry *dns;
  _Bool *local_88;
  ssize_t written;
  ssize_t actualread;
  
  pcVar4 = data->conn;
  cVar3 = (pcVar4->socks_proxy).proxytype;
  puVar5 = (uchar *)(data->state).buffer;
  sockfd = pcVar4->sock[sockindex];
  dns = (Curl_dns_entry *)0x0;
  uVar7 = (pcVar4->cnnct).state - CONNECT_SOCKS_INIT;
  local_88 = done;
  if ((uVar7 < 0x10) || (*done != false)) {
    switch(uVar7) {
    case 0:
      goto switchD_001400ef_caseD_0;
    default:
      goto switchD_001400ef_caseD_1;
    case 3:
      sVar14 = (pcVar4->cnnct).outstanding;
      puVar13 = (pcVar4->cnnct).outp;
      break;
    case 8:
      goto switchD_001400ef_caseD_8;
    case 9:
      dns = Curl_fetch_addr(data,hostname,pcVar4->port);
      if (dns != (Curl_dns_entry *)0x0) {
        (data->state).async.dns = dns;
        puVar2 = &(data->state).async.field_0x28;
        *puVar2 = *puVar2 | 1;
        Curl_infof(data,"Hostname \'%s\' was found",hostname);
        goto LAB_0014022a;
      }
      CVar9 = Curl_resolv_check(data,&dns);
      if (dns == (Curl_dns_entry *)0x0) {
        if (CVar9 != CURLE_OK) {
          return CURLPX_RESOLVE_HOST;
        }
        return CURLPX_OK;
      }
      goto LAB_00140243;
    case 10:
      goto switchD_001400ef_caseD_a;
    case 0xd:
      sVar14 = (pcVar4->cnnct).outstanding;
      puVar13 = (pcVar4->cnnct).outp;
      goto LAB_0014036e;
    }
  }
  else {
    (pcVar4->cnnct).state = CONNECT_SOCKS_INIT;
switchD_001400ef_caseD_0:
    pcVar4->ip_version = '\x01';
    if (((pcVar4->bits).field_0x4 & 1) != 0) {
      pcVar12 = "";
      if (cVar3 == CURLPROXY_SOCKS4A) {
        pcVar12 = "a";
      }
      Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar12,hostname,
                 (ulong)(uint)remote_port);
    }
    Curl_infof(data,"SOCKS4 communication to %s:%d",hostname);
    puVar5[0] = '\x04';
    puVar5[1] = '\x01';
    puVar5[2] = (uchar)((uint)remote_port >> 8);
    puVar5[3] = (uchar)remote_port;
    if (cVar3 != CURLPROXY_SOCKS4A) {
      rVar8 = Curl_resolv(data,hostname,remote_port,false,&dns);
      if (rVar8 == CURLRESOLV_ERROR) {
        return CURLPX_RESOLVE_HOST;
      }
      if (rVar8 == CURLRESOLV_PENDING) {
        if ((data->conn->cnnct).state != CONNECT_RESOLVING) {
          (data->conn->cnnct).state = CONNECT_RESOLVING;
        }
        Curl_infof(data,"SOCKS4 non-blocking resolve of %s",hostname);
        return CURLPX_OK;
      }
LAB_0014022a:
      if ((data->conn->cnnct).state != CONNECT_RESOLVED) {
        (data->conn->cnnct).state = CONNECT_RESOLVED;
      }
switchD_001400ef_caseD_a:
      if (dns == (Curl_dns_entry *)0x0) {
        pcVar12 = "Failed to resolve \"%s\" for SOCKS4 connect.";
        goto LAB_00140267;
      }
LAB_00140243:
      for (ai = dns->addr; ai != (Curl_addrinfo *)0x0; ai = ai->ai_next) {
        if (ai->ai_family == 2) {
          Curl_printable_address(ai,(char *)&actualread,0x40);
          psVar6 = ai->ai_addr;
          puVar5[4] = psVar6->sa_data[2];
          puVar5[5] = psVar6->sa_data[3];
          puVar5[6] = psVar6->sa_data[4];
          puVar5[7] = psVar6->sa_data[5];
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",&actualread);
          Curl_resolv_unlock(data,dns);
          goto switchD_001400ef_caseD_8;
        }
      }
      pcVar12 = "SOCKS4 connection to %s not supported";
LAB_00140267:
      Curl_failf(data,pcVar12,hostname);
      return CURLPX_RESOLVE_HOST;
    }
    if ((data->conn->cnnct).state != CONNECT_REQ_INIT) {
      (data->conn->cnnct).state = CONNECT_REQ_INIT;
    }
switchD_001400ef_caseD_8:
    puVar5[8] = '\0';
    if (proxy_user != (char *)0x0) {
      sVar10 = strlen(proxy_user);
      if ((data->set).buffer_size - 8U <= sVar10) {
        Curl_failf(data,"Too long SOCKS proxy user name, can\'t use!");
        return CURLPX_LONG_USER;
      }
      memcpy(puVar5 + 8,proxy_user,sVar10 + 1);
    }
    sVar10 = strlen((char *)(puVar5 + 8));
    sVar14 = sVar10 + 9;
    if (cVar3 == CURLPROXY_SOCKS4A) {
      puVar5[4] = '\0';
      puVar5[5] = '\0';
      puVar5[6] = '\0';
      puVar5[7] = '\x01';
      sVar10 = strlen(hostname);
      if (0xff < sVar10 + 1) {
        Curl_failf(data,"SOCKS4: too long host name");
        return CURLPX_LONG_HOSTNAME;
      }
      strcpy((char *)(puVar5 + sVar14),hostname);
      sVar14 = sVar14 + sVar10 + 1;
    }
    (pcVar4->cnnct).outp = puVar5;
    (pcVar4->cnnct).outstanding = sVar14;
    puVar13 = puVar5;
    if ((data->conn->cnnct).state != CONNECT_REQ_SENDING) {
      (data->conn->cnnct).state = CONNECT_REQ_SENDING;
    }
LAB_0014036e:
    CVar9 = Curl_write_plain(data,sockfd,puVar13,sVar14,&written);
    if ((CVar9 != CURLE_OK) && (CVar9 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS4 connect request.");
      return CURLPX_SEND_CONNECT;
    }
    lVar11 = (pcVar4->cnnct).outstanding - written;
    if (lVar11 != 0) goto LAB_00140432;
    (pcVar4->cnnct).outstanding = 8;
    (pcVar4->cnnct).outp = puVar5;
    sVar14 = 8;
    puVar13 = puVar5;
    if ((data->conn->cnnct).state != CONNECT_SOCKS_READ) {
      (data->conn->cnnct).state = CONNECT_SOCKS_READ;
    }
  }
  CVar9 = Curl_read_plain(sockfd,(char *)puVar13,sVar14,&actualread);
  if ((CVar9 != CURLE_OK) && (CVar9 != CURLE_AGAIN)) {
    pcVar12 = curl_easy_strerror(CVar9);
    Curl_failf(data,"SOCKS4: Failed receiving connect request ack: %s",pcVar12);
    return CURLPX_RECV_CONNECT;
  }
  if (actualread == 0 && CVar9 == CURLE_OK) {
    Curl_failf(data,"connection to proxy closed");
    return CURLPX_CLOSED;
  }
  lVar11 = (pcVar4->cnnct).outstanding - actualread;
  written = actualread;
  if (lVar11 == 0) {
    if ((data->conn->cnnct).state != CONNECT_DONE) {
      (data->conn->cnnct).state = CONNECT_DONE;
    }
switchD_001400ef_caseD_1:
    if (*puVar5 == '\0') {
      switch(puVar5[1]) {
      case 'Z':
        goto switchD_001404f2_caseD_5a;
      case '[':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                   ,(ulong)puVar5[4],(ulong)puVar5[5],(ulong)puVar5[6],(ulong)puVar5[7],
                   (ulong)(ushort)(*(ushort *)(puVar5 + 2) << 8 | *(ushort *)(puVar5 + 2) >> 8),0x5b
                  );
        return CURLPX_REQUEST_FAILED;
      case '\\':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                   ,(ulong)puVar5[4],(ulong)puVar5[5],(ulong)puVar5[6],(ulong)puVar5[7],
                   (ulong)(ushort)(*(ushort *)(puVar5 + 2) << 8 | *(ushort *)(puVar5 + 2) >> 8),0x5c
                  );
        return CURLPX_IDENTD;
      case ']':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                   ,(ulong)puVar5[4],(ulong)puVar5[5],(ulong)puVar5[6],(ulong)puVar5[7],
                   (ulong)(ushort)(*(ushort *)(puVar5 + 2) << 8 | *(ushort *)(puVar5 + 2) >> 8),0x5d
                  );
        return CURLPX_IDENTD_DIFFER;
      default:
        Curl_failf(data,"Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                   (ulong)puVar5[4],(ulong)puVar5[5],(ulong)puVar5[6],(ulong)puVar5[7],
                   (ulong)(ushort)(*(ushort *)(puVar5 + 2) << 8 | *(ushort *)(puVar5 + 2) >> 8),
                   (ulong)puVar5[1]);
        return CURLPX_UNKNOWN_FAIL;
      }
    }
    Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
    return CURLPX_BAD_VERSION;
  }
LAB_00140432:
  (pcVar4->cnnct).outstanding = lVar11;
  ppuVar1 = &(pcVar4->cnnct).outp;
  *ppuVar1 = *ppuVar1 + written;
  return CURLPX_OK;
switchD_001404f2_caseD_5a:
  pcVar12 = "";
  if (cVar3 == CURLPROXY_SOCKS4A) {
    pcVar12 = "a";
  }
  Curl_infof(data,"SOCKS4%s request granted.",pcVar12);
  *local_88 = true;
  return CURLPX_OK;
}

Assistant:

CURLproxycode Curl_SOCKS4(const char *proxy_user,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  struct connectdata *conn = data->conn;
  const bool protocol4a =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS4A) ? TRUE : FALSE;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;
  ssize_t actualread;
  ssize_t written;

  /* make sure that the buffer is at least 600 bytes */
  DEBUGASSERT(READBUFFER_MIN >= 600);

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    /* SOCKS4 can only do IPv4, insist! */
    conn->ip_version = CURL_IPRESOLVE_V4;
    if(conn->bits.httpproxy)
      infof(data, "SOCKS4%s: connecting to HTTP proxy %s port %d",
            protocol4a ? "a" : "", hostname, remote_port);

    infof(data, "SOCKS4 communication to %s:%d", hostname, remote_port);

    /*
     * Compose socks4 request
     *
     * Request format
     *
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     *     | VN | CD | DSTPORT |      DSTIP        | USERID       |NULL|
     *     +----+----+----+----+----+----+----+----+----+----+....+----+
     * # of bytes:  1    1      2              4           variable       1
     */

    socksreq[0] = 4; /* version (SOCKS4) */
    socksreq[1] = 1; /* connect */
    socksreq[2] = (unsigned char)((remote_port >> 8) & 0xff); /* PORT MSB */
    socksreq[3] = (unsigned char)(remote_port & 0xff);        /* PORT LSB */

    /* DNS resolve only for SOCKS4, not SOCKS4a */
    if(!protocol4a) {
      enum resolve_t rc =
        Curl_resolv(data, hostname, remote_port, FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;
      else if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        infof(data, "SOCKS4 non-blocking resolve of %s", hostname);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }

    /* socks4a doesn't resolve anything locally */
    sxstate(data, CONNECT_REQ_INIT);
    goto CONNECT_REQ_INIT;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, (int)conn->port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "Hostname '%s' was found", hostname);
      sxstate(data, CONNECT_RESOLVED);
    }
    else {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns) {
      hp = dns->addr;

      /* scan for the first IPv4 address */
      while(hp && (hp->ai_family != AF_INET))
        hp = hp->ai_next;

      if(hp) {
        struct sockaddr_in *saddr_in;
        char buf[64];
        Curl_printable_address(hp, buf, sizeof(buf));

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        socksreq[4] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[0];
        socksreq[5] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[1];
        socksreq[6] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[2];
        socksreq[7] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[3];

        infof(data, "SOCKS4 connect to IPv4 %s (locally resolved)", buf);

        Curl_resolv_unlock(data, dns); /* not used anymore from now on */
      }
      else
        failf(data, "SOCKS4 connection to %s not supported", hostname);
    }
    else
      failf(data, "Failed to resolve \"%s\" for SOCKS4 connect.",
            hostname);

    if(!hp)
      return CURLPX_RESOLVE_HOST;
  }
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    /*
     * This is currently not supporting "Identification Protocol (RFC1413)".
     */
    socksreq[8] = 0; /* ensure empty userid is NUL-terminated */
    if(proxy_user) {
      size_t plen = strlen(proxy_user);
      if(plen >= (size_t)data->set.buffer_size - 8) {
        failf(data, "Too long SOCKS proxy user name, can't use!");
        return CURLPX_LONG_USER;
      }
      /* copy the proxy name WITH trailing zero */
      memcpy(socksreq + 8, proxy_user, plen + 1);
    }

    /*
     * Make connection
     */
    {
      size_t packetsize = 9 +
        strlen((char *)socksreq + 8); /* size including NUL */

      /* If SOCKS4a, set special invalid IP address 0.0.0.x */
      if(protocol4a) {
        size_t hostnamelen = 0;
        socksreq[4] = 0;
        socksreq[5] = 0;
        socksreq[6] = 0;
        socksreq[7] = 1;
        /* append hostname */
        hostnamelen = strlen(hostname) + 1; /* length including NUL */
        if(hostnamelen <= 255)
          strcpy((char *)socksreq + packetsize, hostname);
        else {
          failf(data, "SOCKS4: too long host name");
          return CURLPX_LONG_HOSTNAME;
        }
        packetsize += hostnamelen;
      }
      sx->outp = socksreq;
      sx->outstanding = packetsize;
      sxstate(data, CONNECT_REQ_SENDING);
    }
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    /* Send request */
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS4 connect request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }

    /* done sending! */
    sx->outstanding = 8; /* receive data size */
    sx->outp = socksreq;
    sxstate(data, CONNECT_SOCKS_READ);

    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    /* Receive response */
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "SOCKS4: Failed receiving connect request ack: %s",
            curl_easy_strerror(result));
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
    break;
  default: /* lots of unused states in SOCKS4 */
    break;
  }

  /*
   * Response format
   *
   *     +----+----+----+----+----+----+----+----+
   *     | VN | CD | DSTPORT |      DSTIP        |
   *     +----+----+----+----+----+----+----+----+
   * # of bytes:  1    1      2              4
   *
   * VN is the version of the reply code and should be 0. CD is the result
   * code with one of the following values:
   *
   * 90: request granted
   * 91: request rejected or failed
   * 92: request rejected because SOCKS server cannot connect to
   *     identd on the client
   * 93: request rejected because the client program and identd
   *     report different user-ids
   */

  /* wrong version ? */
  if(socksreq[0]) {
    failf(data,
          "SOCKS4 reply has wrong version, version should be 0.");
    return CURLPX_BAD_VERSION;
  }

  /* Result */
  switch(socksreq[1]) {
  case 90:
    infof(data, "SOCKS4%s request granted.", protocol4a?"a":"");
    break;
  case 91:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected or failed.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_REQUEST_FAILED;
  case 92:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because SOCKS server cannot connect to "
          "identd on the client.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD;
  case 93:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", request rejected because the client program and identd "
          "report different user-ids.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_IDENTD_DIFFER;
  default:
    failf(data,
          "Can't complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d)"
          ", Unknown.",
          socksreq[4], socksreq[5], socksreq[6], socksreq[7],
          (((unsigned char)socksreq[2] << 8) | (unsigned char)socksreq[3]),
          (unsigned char)socksreq[1]);
    return CURLPX_UNKNOWN_FAIL;
  }

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}